

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::WriteExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  pointer *ppbVar1;
  EchoProgress *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmTarget *pcVar3;
  cmMakefile *pcVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar9;
  reference s;
  iterator iVar10;
  iterator iVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c60;
  const_iterator local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c38;
  const_iterator local_c30;
  allocator local_c21;
  undefined1 local_c20 [8];
  string symlink;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_be8;
  const_iterator local_be0;
  char *local_bd8;
  char *name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_bc8;
  iterator i;
  string local_ba0 [32];
  int local_b80;
  int local_b7c;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_a00 [8];
  ostringstream majorStream;
  string local_888 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  string target;
  undefined1 local_820 [4];
  OutputFormat output;
  undefined1 local_800 [8];
  string objectDir;
  RuleVariables vars;
  string buildObjs;
  string linkLibs;
  allocator local_6a1;
  undefined1 local_6a0 [6];
  bool useWatcomQuote;
  string responseVar_1;
  undefined1 local_678 [6];
  bool useResponseFileForLibs;
  string responseVar;
  undefined1 local_650 [6];
  bool useResponseFileForObjects;
  char *local_630;
  char *rule;
  undefined1 local_620 [8];
  string implibRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string linkRule;
  undefined1 local_5c0 [8];
  string linkRuleVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  undefined1 local_580 [7];
  bool useLinkScript;
  string local_560;
  undefined1 local_540 [8];
  string implib;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  allocator local_481;
  undefined1 local_480 [8];
  string linkFlagsConfig;
  string local_458;
  allocator local_431;
  undefined1 local_430 [8];
  string export_flag_var;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  undefined1 local_370 [8];
  string linkFlags;
  string flags;
  string local_328;
  allocator local_301;
  string local_300 [8];
  string buildEcho;
  EchoProgress progress;
  undefined1 local_298 [8];
  string linkLanguage;
  string targetOutPathImport;
  string targetOutPathReal;
  string targetOutPath;
  string targetOutPathPDB;
  string targetFullPathImport;
  string targetFullPathPDB;
  string targetFullPathReal;
  string targetFullPath;
  string pdbOutputPath;
  string compilePdbOutputPath;
  undefined1 local_118 [8];
  string outpathImp;
  string outpath;
  string targetNamePDB;
  string targetNameImport;
  string targetNameReal;
  string targetName;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  bool relink_local;
  cmMakefileExecutableTargetGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  std::__cxx11::string::string((string *)(targetNameReal.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(targetNameImport.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(targetNamePDB.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outpath.field_2._M_local_buf + 8));
  cmTarget::GetExecutableNames
            ((this->super_cmMakefileTargetGenerator).Target,
             (string *)(targetNameReal.field_2._M_local_buf + 8),
             (string *)(targetNameImport.field_2._M_local_buf + 8),
             (string *)(targetNamePDB.field_2._M_local_buf + 8),
             (string *)(outpath.field_2._M_local_buf + 8),
             &(this->super_cmMakefileTargetGenerator).ConfigName);
  cmTarget::GetDirectory
            ((string *)((long)&outpathImp.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).Target,
             &(this->super_cmMakefileTargetGenerator).ConfigName,false);
  bVar5 = cmTarget::IsAppBundleOnApple((this->super_cmMakefileTargetGenerator).Target);
  if (bVar5) {
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,
               (string *)((long)&targetNameReal.field_2 + 8),
               (string *)((long)&outpathImp.field_2 + 8));
  }
  std::__cxx11::string::operator+=((string *)(outpathImp.field_2._M_local_buf + 8),"/");
  std::__cxx11::string::string((string *)local_118);
  if (relink) {
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmMakefileTargetGenerator).Makefile)
    ;
    std::__cxx11::string::operator=((string *)(outpathImp.field_2._M_local_buf + 8),pcVar7);
    pcVar7 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)(outpathImp.field_2._M_local_buf + 8),pcVar7);
    std::__cxx11::string::operator+=
              ((string *)(outpathImp.field_2._M_local_buf + 8),"/CMakeRelink.dir");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar7);
    std::__cxx11::string::operator+=((string *)(outpathImp.field_2._M_local_buf + 8),"/");
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_118,(string *)(outpathImp.field_2._M_local_buf + 8));
    }
  }
  else {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar7);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      cmTarget::GetDirectory
                ((string *)((long)&compilePdbOutputPath.field_2 + 8),
                 (this->super_cmMakefileTargetGenerator).Target,
                 &(this->super_cmMakefileTargetGenerator).ConfigName,true);
      std::__cxx11::string::operator=
                ((string *)local_118,(string *)(compilePdbOutputPath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(compilePdbOutputPath.field_2._M_local_buf + 8));
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar7);
      std::__cxx11::string::operator+=((string *)local_118,"/");
    }
  }
  cmTarget::GetCompilePDBDirectory
            ((string *)((long)&pdbOutputPath.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).Target,
             &(this->super_cmMakefileTargetGenerator).ConfigName);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar7);
  cmTarget::GetPDBDirectory
            ((string *)((long)&targetFullPath.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).Target,
             &(this->super_cmMakefileTargetGenerator).ConfigName);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar7);
  std::__cxx11::string::operator+=((string *)(targetFullPath.field_2._M_local_buf + 8),"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetFullPathReal.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&outpathImp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetNameReal.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetFullPathPDB.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&outpathImp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetNameImport.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetFullPathImport.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetFullPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&outpath.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetOutPathPDB.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetNamePDB.field_2 + 8));
  cmMakefileTargetGenerator::Convert
            ((string *)((long)&targetOutPath.field_2 + 8),&this->super_cmMakefileTargetGenerator,
             (string *)((long)&targetFullPathImport.field_2 + 8),NONE,SHELL);
  cmMakefileTargetGenerator::Convert
            ((string *)((long)&targetOutPathReal.field_2 + 8),&this->super_cmMakefileTargetGenerator
             ,(string *)((long)&targetFullPathReal.field_2 + 8),START_OUTPUT,SHELL);
  cmMakefileTargetGenerator::Convert
            ((string *)((long)&targetOutPathImport.field_2 + 8),
             &this->super_cmMakefileTargetGenerator,(string *)((long)&targetFullPathPDB.field_2 + 8)
             ,START_OUTPUT,SHELL);
  cmMakefileTargetGenerator::Convert
            ((string *)((long)&linkLanguage.field_2 + 8),&this->super_cmMakefileTargetGenerator,
             (string *)((long)&targetOutPathPDB.field_2 + 8),START_OUTPUT,SHELL);
  cmTarget::GetLinkerLanguage
            ((string *)local_298,(this->super_cmMakefileTargetGenerator).Target,
             &(this->super_cmMakefileTargetGenerator).ConfigName);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    (this->super_cmMakefileTargetGenerator).NumberOfProgressActions =
         (this->super_cmMakefileTargetGenerator).NumberOfProgressActions + 1;
    if (((this->super_cmMakefileTargetGenerator).NoRuleMessages & 1U) == 0) {
      this_00 = (EchoProgress *)((long)&buildEcho.field_2 + 8);
      cmLocalUnixMakefileGenerator3::EchoProgress::EchoProgress(this_00);
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"Linking ",&local_301);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      std::__cxx11::string::operator+=(local_300,(string *)local_298);
      std::__cxx11::string::operator+=(local_300," executable ");
      std::__cxx11::string::operator+=
                (local_300,(string *)(targetOutPathReal.field_2._M_local_buf + 8));
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_328,pcVar7,(allocator *)(flags.field_2._M_local_buf + 0xf));
      cmLocalUnixMakefileGenerator3::AppendEcho
                (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_328,EchoLink,
                 (EchoProgress *)((long)&buildEcho.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string(local_300);
      cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress
                ((EchoProgress *)((long)&buildEcho.field_2 + 8));
    }
    std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_370);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"CMAKE_EXE_LINKER_FLAGS",&local_391);
    cmLocalGenerator::AddConfigVariableFlags
              (&pcVar2->super_cmLocalGenerator,(string *)local_370,&local_390,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    pcVar3 = (this->super_cmMakefileTargetGenerator).Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"WIN32_EXECUTABLE",&local_3b9);
    bVar5 = cmTarget::GetPropertyAsBool(pcVar3,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    if (bVar5) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar4 = (this->super_cmMakefileTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e0,"CMAKE_CREATE_WIN32_EXE",&local_3e1);
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&local_3e0);
      (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,local_370,pcVar7);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    }
    else {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar4 = (this->super_cmMakefileTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_408,"CMAKE_CREATE_CONSOLE_EXE",
                 (allocator *)(export_flag_var.field_2._M_local_buf + 0xf));
      pcVar7 = cmMakefile::GetDefinition(pcVar4,&local_408);
      (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,local_370,pcVar7);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator
                ((allocator<char> *)(export_flag_var.field_2._M_local_buf + 0xf));
    }
    bVar5 = cmTarget::IsExecutableWithExports((this->super_cmMakefileTargetGenerator).Target);
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_430,"CMAKE_EXE_EXPORTS_",&local_431);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
      std::__cxx11::string::operator+=((string *)local_430,(string *)local_298);
      std::__cxx11::string::operator+=((string *)local_430,"_FLAG");
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar7 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).Makefile,(string *)local_430);
      (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,local_370,pcVar7);
      std::__cxx11::string::~string((string *)local_430);
    }
    cmMakefileTargetGenerator::AddFeatureFlags
              (&this->super_cmMakefileTargetGenerator,(string *)((long)&linkFlags.field_2 + 8),
               (string *)local_298);
    cmLocalGenerator::AddArchitectureFlags
              (&((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalGenerator,
               (string *)((long)&linkFlags.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).GeneratorTarget,(string *)local_298,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
    pcVar3 = (this->super_cmMakefileTargetGenerator).Target;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_458,"LINK_FLAGS",
               (allocator *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    pcVar7 = cmTarget::GetProperty(pcVar3,&local_458);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,local_370,pcVar7);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator
              ((allocator<char> *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_480,"LINK_FLAGS_",&local_481);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    cmsys::SystemTools::UpperCase
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
    std::__cxx11::string::operator+=
              ((string *)local_480,
               (string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &exeCleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar7 = cmTarget::GetProperty
                       ((this->super_cmMakefileTargetGenerator).Target,(string *)local_480);
    (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar2,local_370,pcVar7);
    cmMakefileTargetGenerator::AddModuleDefinitionFlag
              (&this->super_cmMakefileTargetGenerator,(string *)local_370);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4c0);
    cmMakefileTargetGenerator::Convert
              (&local_4e0,&this->super_cmMakefileTargetGenerator,
               (string *)((long)&targetFullPathReal.field_2 + 8),START_OUTPUT,UNCHANGED);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetNameImport.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetNameReal.field_2 + 8));
    if (bVar5) {
      cmMakefileTargetGenerator::Convert
                (&local_500,&this->super_cmMakefileTargetGenerator,
                 (string *)((long)&targetFullPathPDB.field_2 + 8),START_OUTPUT,UNCHANGED);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4c0,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      cmMakefileTargetGenerator::Convert
                ((string *)((long)&implib.field_2 + 8),&this->super_cmMakefileTargetGenerator,
                 (string *)((long)&targetOutPathPDB.field_2 + 8),START_OUTPUT,UNCHANGED);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4c0,(value_type *)((long)&implib.field_2 + 8));
      std::__cxx11::string::~string((string *)(implib.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_540);
      bVar5 = cmTarget::GetImplibGNUtoMS
                        ((this->super_cmMakefileTargetGenerator).Target,
                         (string *)((long)&targetOutPathPDB.field_2 + 8),(string *)local_540,
                         (char *)0x0);
      if (bVar5) {
        cmMakefileTargetGenerator::Convert
                  (&local_560,&this->super_cmMakefileTargetGenerator,(string *)local_540,
                   START_OUTPUT,UNCHANGED);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c0,&local_560);
        std::__cxx11::string::~string((string *)&local_560);
      }
      std::__cxx11::string::~string((string *)local_540);
    }
    cmMakefileTargetGenerator::Convert
              ((string *)local_580,&this->super_cmMakefileTargetGenerator,
               (string *)((long)&targetFullPathImport.field_2 + 8),START_OUTPUT,UNCHANGED);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_cmMakefileTargetGenerator).CleanFiles,(value_type *)local_580);
    std::__cxx11::string::~string((string *)local_580);
    if (!relink) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmTarget::GetPreBuildCommands((this->super_cmMakefileTargetGenerator).Target);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9,
                 (this->super_cmMakefileTargetGenerator).Target,HOME_OUTPUT);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmTarget::GetPreLinkCommands((this->super_cmMakefileTargetGenerator).Target);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9,
                 (this->super_cmMakefileTargetGenerator).Target,HOME_OUTPUT);
    }
    bVar5 = cmGlobalGenerator::GetUseLinkScript
                      (&((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
                        super_cmGlobalGenerator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&linkRuleVar.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_5c0,"CMAKE_",(allocator *)(linkRule.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(linkRule.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_5c0,(string *)local_298);
    std::__cxx11::string::operator+=((string *)local_5c0,"_LINK_EXECUTABLE");
    cmMakefileTargetGenerator::GetLinkRule
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &this->super_cmMakefileTargetGenerator,(string *)local_5c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&implibRuleVar.field_2 + 8));
    cmSystemTools::ExpandListArgument
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&linkRuleVar.field_2 + 8),false);
    bVar6 = cmTarget::IsExecutableWithExports((this->super_cmMakefileTargetGenerator).Target);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_620,"CMAKE_",(allocator *)((long)&rule + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&rule + 7));
      std::__cxx11::string::operator+=((string *)local_620,(string *)local_298);
      std::__cxx11::string::operator+=((string *)local_620,"_CREATE_IMPORT_LIBRARY");
      pcVar7 = cmMakefile::GetDefinition
                         ((this->super_cmMakefileTargetGenerator).Makefile,(string *)local_620);
      local_630 = pcVar7;
      if (pcVar7 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_650,pcVar7,(allocator *)(responseVar.field_2._M_local_buf + 0xf))
        ;
        cmSystemTools::ExpandListArgument
                  ((string *)local_650,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&linkRuleVar.field_2 + 8),false);
        std::__cxx11::string::~string((string *)local_650);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(responseVar.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)local_620);
    }
    responseVar.field_2._M_local_buf[0xe] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_678,"CMAKE_",(allocator *)(responseVar_1.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(responseVar_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_678,(string *)local_298);
    std::__cxx11::string::operator+=((string *)local_678,"_USE_RESPONSE_FILE_FOR_OBJECTS");
    bVar6 = cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).Makefile,(string *)local_678);
    if (bVar6) {
      responseVar.field_2._M_local_buf[0xe] = '\x01';
    }
    std::__cxx11::string::~string((string *)local_678);
    responseVar_1.field_2._M_local_buf[0xe] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_6a0,"CMAKE_",&local_6a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    std::__cxx11::string::operator+=((string *)local_6a0,(string *)local_298);
    std::__cxx11::string::operator+=((string *)local_6a0,"_USE_RESPONSE_FILE_FOR_LIBRARIES");
    bVar6 = cmMakefile::IsOn((this->super_cmMakefileTargetGenerator).Makefile,(string *)local_6a0);
    if (bVar6) {
      responseVar_1.field_2._M_local_buf[0xe] = '\x01';
    }
    std::__cxx11::string::~string((string *)local_6a0);
    pcVar4 = (this->super_cmMakefileTargetGenerator).Makefile;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&linkLibs.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                   "_USE_WATCOM_QUOTE");
    bVar6 = cmMakefile::IsOn(pcVar4,(string *)((long)&linkLibs.field_2 + 8));
    std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalGenerator).
                super_cmOutputConverter,bVar5);
    std::__cxx11::string::string((string *)(buildObjs.field_2._M_local_buf + 8));
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,(string *)(buildObjs.field_2._M_local_buf + 8)
               ,relink,(bool)(responseVar_1.field_2._M_local_buf[0xe] & 1),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,bVar6);
    std::__cxx11::string::string((string *)&vars.FilterPrefix);
    cmMakefileTargetGenerator::CreateObjectLists
              (&this->super_cmMakefileTargetGenerator,bVar5,false,
               (bool)(responseVar.field_2._M_local_buf[0xe] & 1),(string *)&vars.FilterPrefix,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,bVar6);
    cmLocalGenerator::RuleVariables::RuleVariables((RuleVariables *)((long)&objectDir.field_2 + 8));
    vars.Defines = "RULE_LAUNCH_LINK";
    objectDir.field_2._8_8_ = (this->super_cmMakefileTargetGenerator).Target;
    vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
    vars.Language = (char *)std::__cxx11::string::c_str();
    cmTarget::GetSupportDirectory_abi_cxx11_
              ((string *)local_800,(this->super_cmMakefileTargetGenerator).Target);
    cmMakefileTargetGenerator::Convert
              ((string *)local_820,&this->super_cmMakefileTargetGenerator,(string *)local_800,
               START_OUTPUT,SHELL);
    std::__cxx11::string::operator=((string *)local_800,(string *)local_820);
    std::__cxx11::string::~string((string *)local_820);
    vars.Object = (char *)std::__cxx11::string::c_str();
    cmMakefileTargetGenerator::Convert
              ((string *)((long)&targetVersionMajor.field_2 + 8),
               &this->super_cmMakefileTargetGenerator,
               (string *)((long)&targetFullPathPDB.field_2 + 8),START_OUTPUT,bVar6 | SHELL);
    vars.Objects = (char *)std::__cxx11::string::c_str();
    vars.CMTarget = (cmTarget *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_888);
    std::__cxx11::ostringstream::ostringstream(local_a00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    cmTarget::GetTargetVersion((this->super_cmMakefileTargetGenerator).Target,&local_b7c,&local_b80)
    ;
    std::ostream::operator<<(local_a00,local_b7c);
    std::ostream::operator<<(&minor,local_b80);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_ba0);
    std::__cxx11::string::~string(local_ba0);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_888,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_a00);
    vars.TargetCompilePDB = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMajor = (char *)std::__cxx11::string::c_str();
    vars.Target = (char *)std::__cxx11::string::c_str();
    vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=
              ((string *)
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalGenerator).
                TargetImplib,(string *)(linkLanguage.field_2._M_local_buf + 8));
    local_bc8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8));
    while( true ) {
      name = (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&linkRuleVar.field_2 + 8));
      bVar6 = __gnu_cxx::operator!=
                        (&local_bc8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&name);
      if (!bVar6) break;
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_bc8);
      cmLocalGenerator::ExpandRuleVariables
                (&pcVar2->super_cmLocalGenerator,s,(RuleVariables *)((long)&objectDir.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_bc8);
    }
    std::__cxx11::string::operator=
              ((string *)
               &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalGenerator).
                TargetImplib,"");
    cmOutputConverter::SetLinkScriptShell
              (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalGenerator).
                super_cmOutputConverter,false);
    std::__cxx11::string::~string(local_888);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetVersionMajor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_800);
    std::__cxx11::string::~string((string *)&vars.FilterPrefix);
    std::__cxx11::string::~string((string *)(buildObjs.field_2._M_local_buf + 8));
    if (bVar5) {
      local_bd8 = "link.txt";
      if (relink) {
        local_bd8 = "relink.txt";
      }
      cmMakefileTargetGenerator::CreateLinkScript
                (&this->super_cmMakefileTargetGenerator,local_bd8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&linkRuleVar.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&implibRuleVar.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&implibRuleVar.field_2 + 8),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&linkRuleVar.field_2 + 8));
    }
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmMakefileTargetGenerator).Makefile)
    ;
    cmLocalUnixMakefileGenerator3::CreateCDCommand
              (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&implibRuleVar.field_2 + 8),pcVar7,HOME_OUTPUT);
    ppbVar1 = &depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_be8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_be0,&local_be8);
    pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&implibRuleVar.field_2 + 8);
    iVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar12);
    iVar11 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar12);
    symlink.field_2._8_8_ =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar1,
                    local_be0,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )iVar10._M_current,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )iVar11._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&implibRuleVar.field_2 + 8));
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetOutPathReal.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetOutPathImport.field_2 + 8));
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_c20,"$(CMAKE_COMMAND) -E cmake_symlink_executable ",&local_c21);
      std::allocator<char>::~allocator((allocator<char> *)&local_c21);
      std::__cxx11::string::operator+=
                ((string *)local_c20,(string *)(targetOutPathImport.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_c20," ");
      std::__cxx11::string::operator+=
                ((string *)local_c20,(string *)(targetOutPathReal.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&implibRuleVar.field_2 + 8),(value_type *)local_c20);
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar7 = cmMakefile::GetCurrentBinaryDirectory
                         ((this->super_cmMakefileTargetGenerator).Makefile);
      cmLocalUnixMakefileGenerator3::CreateCDCommand
                (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&implibRuleVar.field_2 + 8),pcVar7,HOME_OUTPUT);
      ppbVar1 = &depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c38._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_c30,&local_c38);
      pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&implibRuleVar.field_2 + 8);
      local_c40._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar12);
      local_c48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar12);
      local_c50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             ppbVar1,local_c30,local_c40,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_c48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&implibRuleVar.field_2 + 8));
      std::__cxx11::string::~string((string *)local_c20);
    }
    if (!relink) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pvVar9 = cmTarget::GetPostBuildCommands((this->super_cmMakefileTargetGenerator).Target);
      cmLocalUnixMakefileGenerator3::AppendCustomCommands
                (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9,
                 (this->super_cmMakefileTargetGenerator).Target,HOME_OUTPUT);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,
               (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
               (string *)((long)&targetFullPathPDB.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,false,false);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetFullPathReal.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&targetFullPathPDB.field_2 + 8));
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,(value_type *)((long)&targetFullPathPDB.field_2 + 8));
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 (string *)((long)&targetFullPathReal.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,false,false);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,
               (string *)((long)&targetFullPathReal.field_2 + 8),relink);
    pvVar12 = &(this->super_cmMakefileTargetGenerator).CleanFiles;
    local_c60._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar12);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_c58,&local_c60);
    iVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4c0);
    iVar11 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4c0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar12,
               local_c58,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar10._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar11._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&implibRuleVar.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &commands1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_5c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&linkRuleVar.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4c0);
    std::__cxx11::string::~string((string *)local_480);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
  }
  else {
    cmTarget::GetName_abi_cxx11_((this->super_cmMakefileTargetGenerator).Target);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("Cannot determine link language for target \"",pcVar7,"\".",(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)(linkLanguage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetOutPathImport.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetOutPathReal.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetOutPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetOutPathPDB.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetFullPathImport.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetFullPathPDB.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetFullPathReal.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetFullPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pdbOutputPath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(outpathImp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(outpath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetNamePDB.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetNameImport.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(targetNameReal.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteExecutableRule(bool relink)
{
  std::vector<std::string> commands;

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends);

  // Get the name of the executable to generate.
  std::string targetName;
  std::string targetNameReal;
  std::string targetNameImport;
  std::string targetNamePDB;
  this->Target->GetExecutableNames
    (targetName, targetNameReal, targetNameImport, targetNamePDB,
     this->ConfigName);

  // Construct the full path version of the names.
  std::string outpath = this->Target->GetDirectory(this->ConfigName);
  if(this->Target->IsAppBundleOnApple())
    {
    this->OSXBundleGenerator->CreateAppBundle(targetName, outpath);
    }
  outpath += "/";
  std::string outpathImp;
  if(relink)
    {
    outpath = this->Makefile->GetCurrentBinaryDirectory();
    outpath += cmake::GetCMakeFilesDirectory();
    outpath += "/CMakeRelink.dir";
    cmSystemTools::MakeDirectory(outpath.c_str());
    outpath += "/";
    if(!targetNameImport.empty())
      {
      outpathImp = outpath;
      }
    }
  else
    {
    cmSystemTools::MakeDirectory(outpath.c_str());
    if(!targetNameImport.empty())
      {
      outpathImp = this->Target->GetDirectory(this->ConfigName, true);
      cmSystemTools::MakeDirectory(outpathImp.c_str());
      outpathImp += "/";
      }
    }

  std::string compilePdbOutputPath =
    this->Target->GetCompilePDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(compilePdbOutputPath.c_str());

  std::string pdbOutputPath = this->Target->GetPDBDirectory(this->ConfigName);
  cmSystemTools::MakeDirectory(pdbOutputPath.c_str());
  pdbOutputPath += "/";

  std::string targetFullPath = outpath + targetName;
  std::string targetFullPathReal = outpath + targetNameReal;
  std::string targetFullPathPDB =  pdbOutputPath + targetNamePDB;
  std::string targetFullPathImport = outpathImp + targetNameImport;
  std::string targetOutPathPDB =
    this->Convert(targetFullPathPDB,
                  cmLocalGenerator::NONE,
                  cmLocalGenerator::SHELL);
  // Convert to the output path to use in constructing commands.
  std::string targetOutPath =
    this->Convert(targetFullPath,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathReal =
    this->Convert(targetFullPathReal,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);
  std::string targetOutPathImport =
    this->Convert(targetFullPathImport,
                  cmLocalGenerator::START_OUTPUT,
                  cmLocalGenerator::SHELL);

  // Get the language to use for linking this executable.
  std::string linkLanguage =
    this->Target->GetLinkerLanguage(this->ConfigName);

  // Make sure we have a link language.
  if(linkLanguage.empty())
    {
    cmSystemTools::Error("Cannot determine link language for target \"",
                         this->Target->GetName().c_str(), "\".");
    return;
    }

  this->NumberOfProgressActions++;
  if(!this->NoRuleMessages)
    {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " executable ";
    buildEcho += targetOutPath;
    this->LocalGenerator->AppendEcho(commands, buildEcho.c_str(),
                                     cmLocalUnixMakefileGenerator3::EchoLink,
                                     &progress);
    }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  this->LocalGenerator->
    AddConfigVariableFlags(linkFlags, "CMAKE_EXE_LINKER_FLAGS",
                           this->ConfigName);


  if(this->Target->GetPropertyAsBool("WIN32_EXECUTABLE"))
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_WIN32_EXE"));
    }
  else
    {
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition("CMAKE_CREATE_CONSOLE_EXE"));
    }

  // Add symbol export flags if necessary.
  if(this->Target->IsExecutableWithExports())
    {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags
      (linkFlags, this->Makefile->GetDefinition(export_flag_var));
    }

  // Add language feature flags.
  this->AddFeatureFlags(flags, linkLanguage);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->LocalGenerator->AppendFlags
    (linkFlags, this->Target->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (linkFlags, this->Target->GetProperty(linkFlagsConfig));

  this->AddModuleDefinitionFlag(linkFlags);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->Convert(targetFullPath,
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#ifdef _WIN32
  // There may be a manifest file for this target.  Add it to the
  // clean set just in case.
  exeCleanFiles.push_back(this->Convert((targetFullPath+".manifest").c_str(),
                                        cmLocalGenerator::START_OUTPUT,
                                        cmLocalGenerator::UNCHANGED));
#endif
  if(targetNameReal != targetName)
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathReal,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    }
  if(!targetNameImport.empty())
    {
    exeCleanFiles.push_back(this->Convert(targetFullPathImport,
                                          cmLocalGenerator::START_OUTPUT,
                                          cmLocalGenerator::UNCHANGED));
    std::string implib;
    if(this->Target->GetImplibGNUtoMS(targetFullPathImport, implib))
      {
      exeCleanFiles.push_back(this->Convert(implib,
                                            cmLocalGenerator::START_OUTPUT,
                                            cmLocalGenerator::UNCHANGED));
      }
    }

  // List the PDB for cleaning only when the whole target is
  // cleaned.  We do not want to delete the .pdb file just before
  // linking the target.
  this->CleanFiles.push_back
    (this->Convert(targetFullPathPDB,
                   cmLocalGenerator::START_OUTPUT,
                   cmLocalGenerator::UNCHANGED));

  // Add the pre-build and pre-link rules building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator
      ->AppendCustomCommands(commands, this->Target->GetPreBuildCommands(),
                             this->Target);
    this->LocalGenerator
      ->AppendCustomCommands(commands, this->Target->GetPreLinkCommands(),
                             this->Target);
    }

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_LINK_EXECUTABLE";
  std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);
  if(this->Target->IsExecutableWithExports())
    {
    // If a separate rule for creating an import library is specified
    // add it now.
    std::string implibRuleVar = "CMAKE_";
    implibRuleVar += linkLanguage;
    implibRuleVar += "_CREATE_IMPORT_LIBRARY";
    if(const char* rule =
       this->Makefile->GetDefinition(implibRuleVar))
      {
      cmSystemTools::ExpandListArgument(rule, real_link_commands);
      }
    }

  // Select whether to use a response file for objects.
  bool useResponseFileForObjects = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_OBJECTS";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForObjects = true;
    }
  }

  // Select whether to use a response file for libraries.
  bool useResponseFileForLibs = false;
  {
  std::string responseVar = "CMAKE_";
  responseVar += linkLanguage;
  responseVar += "_USE_RESPONSE_FILE_FOR_LIBRARIES";
  if(this->Makefile->IsOn(responseVar))
    {
    useResponseFileForLibs = true;
    }
  }

  // Expand the rule variables.
  {
  bool useWatcomQuote = this->Makefile->IsOn(linkRuleVar+"_USE_WATCOM_QUOTE");

  // Set path conversion for link script shells.
  this->LocalGenerator->SetLinkScriptShell(useLinkScript);

  // Collect up flags to link in needed libraries.
  std::string linkLibs;
  this->CreateLinkLibs(linkLibs, relink, useResponseFileForLibs, depends,
                       useWatcomQuote);

  // Construct object file lists that may be needed to expand the
  // rule.
  std::string buildObjs;
  this->CreateObjectLists(useLinkScript, false,
                          useResponseFileForObjects, buildObjs, depends,
                          useWatcomQuote);

  cmLocalGenerator::RuleVariables vars;
  vars.RuleLauncher = "RULE_LAUNCH_LINK";
  vars.CMTarget = this->Target;
  vars.Language = linkLanguage.c_str();
  vars.Objects = buildObjs.c_str();
  std::string objectDir = this->Target->GetSupportDirectory();
  objectDir = this->Convert(objectDir,
                            cmLocalGenerator::START_OUTPUT,
                            cmLocalGenerator::SHELL);
  vars.ObjectDir = objectDir.c_str();
  cmLocalGenerator::OutputFormat output = (useWatcomQuote) ?
    cmLocalGenerator::WATCOMQUOTE : cmLocalGenerator::SHELL;
  std::string target = this->Convert(targetFullPathReal,
                                     cmLocalGenerator::START_OUTPUT,
                                     output);
  vars.Target = target.c_str();
  vars.TargetPDB = targetOutPathPDB.c_str();

  // Setup the target version.
  std::string targetVersionMajor;
  std::string targetVersionMinor;
  {
  std::ostringstream majorStream;
  std::ostringstream minorStream;
  int major;
  int minor;
  this->Target->GetTargetVersion(major, minor);
  majorStream << major;
  minorStream << minor;
  targetVersionMajor = majorStream.str();
  targetVersionMinor = minorStream.str();
  }
  vars.TargetVersionMajor = targetVersionMajor.c_str();
  vars.TargetVersionMinor = targetVersionMinor.c_str();

  vars.LinkLibraries = linkLibs.c_str();
  vars.Flags = flags.c_str();
  vars.LinkFlags = linkFlags.c_str();
  // Expand placeholders in the commands.
  this->LocalGenerator->TargetImplib = targetOutPathImport;
  for(std::vector<std::string>::iterator i = real_link_commands.begin();
      i != real_link_commands.end(); ++i)
    {
    this->LocalGenerator->ExpandRuleVariables(*i, vars);
    }
  this->LocalGenerator->TargetImplib = "";

  // Restore path conversion to normal shells.
  this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if(useLinkScript)
    {
    // Use a link script.
    const char* name = (relink? "relink.txt" : "link.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
    }
  else
    {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
    }
  this->LocalGenerator->CreateCDCommand
    (commands1,
     this->Makefile->GetCurrentBinaryDirectory(),
     cmLocalGenerator::HOME_OUTPUT);
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Add a rule to create necessary symlinks for the library.
  if(targetOutPath != targetOutPathReal)
    {
    std::string symlink = "$(CMAKE_COMMAND) -E cmake_symlink_executable ";
    symlink += targetOutPathReal;
    symlink += " ";
    symlink += targetOutPath;
    commands1.push_back(symlink);
    this->LocalGenerator->CreateCDCommand(commands1,
                                  this->Makefile->GetCurrentBinaryDirectory(),
                                  cmLocalGenerator::HOME_OUTPUT);
    commands.insert(commands.end(), commands1.begin(), commands1.end());
    commands1.clear();
    }

  // Add the post-build rules when building but not when relinking.
  if(!relink)
    {
    this->LocalGenerator->
      AppendCustomCommands(commands, this->Target->GetPostBuildCommands(),
                           this->Target);
    }

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream,
                                      0,
                                      targetFullPathReal,
                                      depends, commands, false);

  // The symlink name for the target should depend on the real target
  // so if the target version changes it rebuilds and recreates the
  // symlink.
  if(targetFullPath != targetFullPathReal)
    {
    depends.clear();
    commands.clear();
    depends.push_back(targetFullPathReal);
    this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, 0,
                                        targetFullPath,
                                        depends, commands, false);
    }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetFullPath, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(),
                          exeCleanFiles.begin(),
                          exeCleanFiles.end());
}